

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::filesystem_error::~filesystem_error(filesystem_error *this)

{
  filesystem_error *this_local;
  
  *(undefined ***)this = &PTR__filesystem_error_00305a78;
  filesystem::path::~path(&this->_p2);
  filesystem::path::~path(&this->_p1);
  std::__cxx11::string::~string((string *)&this->_what_arg);
  std::system_error::~system_error(&this->super_system_error);
  return;
}

Assistant:

class GHC_FS_API_CLASS filesystem_error : public std::system_error
{
public:
    filesystem_error(const std::string& what_arg, std::error_code ec);
    filesystem_error(const std::string& what_arg, const path& p1, std::error_code ec);
    filesystem_error(const std::string& what_arg, const path& p1, const path& p2, std::error_code ec);
    const path& path1() const noexcept;
    const path& path2() const noexcept;
    const char* what() const noexcept override;

private:
    std::string _what_arg;
    std::error_code _ec;
    path _p1, _p2;
}